

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_chroma_horz_w16out_ssse3
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined1 (*pauVar1) [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 *puVar15;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  int in_R9D;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int offset_1;
  int offset;
  __m128i res_temp13_8x16b;
  __m128i res_temp12_8x16b;
  __m128i res_temp11_8x16b;
  __m128i res_temp3_8x16b;
  __m128i res_temp2_8x16b;
  __m128i res_temp1_8x16b;
  __m128i src_temp16_16x8b;
  __m128i src_temp15_16x8b;
  __m128i src_temp14_16x8b;
  __m128i src_temp13_16x8b;
  __m128i src_temp12_16x8b;
  __m128i src_temp11_16x8b;
  __m128i src_temp6_16x8b;
  __m128i src_temp5_16x8b;
  __m128i src_temp4_16x8b;
  __m128i src_temp3_16x8b;
  __m128i src_temp2_16x8b;
  __m128i src_temp1_16x8b;
  __m128i all_zero;
  __m128i control_mask_2_8x16b;
  __m128i control_mask_1_8x16b;
  __m128i coeff2_3_8x16b;
  __m128i coeff0_1_8x16b;
  WORD32 col;
  WORD32 row;
  int local_730;
  int local_72c;
  int local_5b4;
  int local_5b0;
  long local_598;
  long local_590;
  undefined1 local_438;
  undefined1 uStack_437;
  undefined1 uStack_436;
  undefined1 uStack_435;
  undefined1 uStack_434;
  undefined1 uStack_433;
  undefined1 uStack_432;
  undefined1 uStack_431;
  undefined1 local_428;
  undefined1 uStack_427;
  undefined1 uStack_426;
  undefined1 uStack_425;
  undefined1 uStack_424;
  undefined1 uStack_423;
  undefined1 uStack_422;
  undefined1 uStack_421;
  undefined1 local_418;
  undefined1 uStack_417;
  undefined1 uStack_416;
  undefined1 uStack_415;
  undefined1 uStack_414;
  undefined1 uStack_413;
  undefined1 uStack_412;
  undefined1 uStack_411;
  undefined1 local_408;
  undefined1 uStack_407;
  undefined1 uStack_406;
  undefined1 uStack_405;
  undefined1 uStack_404;
  undefined1 uStack_403;
  undefined1 uStack_402;
  undefined1 uStack_401;
  undefined1 local_3f8;
  undefined1 uStack_3f7;
  undefined1 uStack_3f6;
  undefined1 uStack_3f5;
  undefined1 uStack_3f4;
  undefined1 uStack_3f3;
  undefined1 uStack_3f2;
  undefined1 uStack_3f1;
  undefined1 local_3e8;
  undefined1 uStack_3e7;
  undefined1 uStack_3e6;
  undefined1 uStack_3e5;
  undefined1 uStack_3e4;
  undefined1 uStack_3e3;
  undefined1 uStack_3e2;
  undefined1 uStack_3e1;
  undefined1 local_3d8;
  undefined1 uStack_3d7;
  undefined1 uStack_3d6;
  undefined1 uStack_3d5;
  undefined1 uStack_3d4;
  undefined1 uStack_3d3;
  undefined1 uStack_3d2;
  undefined1 uStack_3d1;
  undefined1 local_3c8;
  undefined1 uStack_3c7;
  undefined1 uStack_3c6;
  undefined1 uStack_3c5;
  undefined1 uStack_3c4;
  undefined1 uStack_3c3;
  undefined1 uStack_3c2;
  undefined1 uStack_3c1;
  undefined1 local_3b8;
  undefined1 uStack_3b7;
  undefined1 uStack_3b6;
  undefined1 uStack_3b5;
  undefined1 uStack_3b4;
  undefined1 uStack_3b3;
  undefined1 uStack_3b2;
  undefined1 uStack_3b1;
  undefined1 local_3a8;
  undefined1 uStack_3a7;
  undefined1 uStack_3a6;
  undefined1 uStack_3a5;
  undefined1 uStack_3a4;
  undefined1 uStack_3a3;
  undefined1 uStack_3a2;
  undefined1 uStack_3a1;
  undefined1 local_398;
  undefined1 uStack_397;
  undefined1 uStack_396;
  undefined1 uStack_395;
  undefined1 uStack_394;
  undefined1 uStack_393;
  undefined1 uStack_392;
  undefined1 uStack_391;
  undefined1 local_388;
  undefined1 uStack_387;
  undefined1 uStack_386;
  undefined1 uStack_385;
  undefined1 uStack_384;
  undefined1 uStack_383;
  undefined1 uStack_382;
  undefined1 uStack_381;
  undefined1 local_378;
  undefined1 uStack_377;
  undefined1 uStack_376;
  undefined1 uStack_375;
  undefined1 local_368;
  undefined1 uStack_367;
  undefined1 uStack_366;
  undefined1 uStack_365;
  undefined1 local_358;
  undefined1 uStack_357;
  undefined1 uStack_356;
  undefined1 uStack_355;
  undefined1 local_348;
  undefined1 uStack_347;
  undefined1 uStack_346;
  undefined1 uStack_345;
  undefined1 local_338;
  undefined1 uStack_337;
  undefined1 uStack_336;
  undefined1 uStack_335;
  undefined1 local_328;
  undefined1 uStack_327;
  undefined1 uStack_326;
  undefined1 uStack_325;
  undefined1 local_318;
  undefined1 uStack_317;
  undefined1 uStack_316;
  undefined1 uStack_315;
  undefined1 local_308;
  undefined1 uStack_307;
  undefined1 uStack_306;
  undefined1 uStack_305;
  undefined1 local_2f8;
  undefined1 uStack_2f7;
  undefined1 uStack_2f6;
  undefined1 uStack_2f5;
  undefined1 local_2e8;
  undefined1 uStack_2e7;
  undefined1 uStack_2e6;
  undefined1 uStack_2e5;
  undefined1 local_2d8;
  undefined1 uStack_2d7;
  undefined1 uStack_2d6;
  undefined1 uStack_2d5;
  undefined1 local_2c8;
  undefined1 uStack_2c7;
  undefined1 uStack_2c6;
  undefined1 uStack_2c5;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  
  if (offset_1 % 2 != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x1150,
                  "void ihevc_inter_pred_chroma_horz_w16out_ssse3(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *in_R8;
  auVar16._8_8_ = 0x100010001000100;
  auVar16._0_8_ = 0x100010001000100;
  auVar16 = pshufb(auVar19,auVar16);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *in_R8;
  auVar17._8_8_ = 0x302030203020302;
  auVar17._0_8_ = 0x302030203020302;
  auVar17 = pshufb(auVar18,auVar17);
  local_5b0 = in_R9D;
  local_598 = in_RSI;
  local_590 = in_RDI;
  if ((offset_1 % 2 == 0) && (offset_1 % 4 != 0)) {
    for (; 1 < local_5b0; local_5b0 = local_5b0 + -2) {
      local_72c = 0;
      for (local_5b4 = 0; SBORROW4(local_5b4,offset_1 * 2) != local_5b4 + offset_1 * -2 < 0;
          local_5b4 = local_5b4 + 4) {
        pauVar1 = (undefined1 (*) [16])(local_590 + -2 + (long)local_72c);
        uVar2 = *(undefined8 *)*pauVar1;
        auVar4 = *pauVar1;
        auVar19 = *pauVar1;
        auVar18 = *pauVar1;
        pauVar1 = (undefined1 (*) [16])((long)local_72c + -2 + local_590 + in_EDX);
        uVar3 = *(undefined8 *)*pauVar1;
        auVar9 = *pauVar1;
        auVar8 = *pauVar1;
        auVar7 = *pauVar1;
        local_2c8 = (undefined1)uVar2;
        uStack_2c7 = (undefined1)((ulong)uVar2 >> 8);
        uStack_2c6 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_2c5 = (undefined1)((ulong)uVar2 >> 0x18);
        local_2d8 = auVar18[2];
        uStack_2d7 = auVar18[3];
        uStack_2d6 = auVar18[4];
        uStack_2d5 = auVar18[5];
        local_2e8 = auVar19[4];
        uStack_2e7 = auVar19[5];
        uStack_2e6 = auVar19[6];
        uStack_2e5 = auVar19[7];
        local_2f8 = auVar4[6];
        uStack_2f7 = auVar4[7];
        uStack_2f6 = auVar4[8];
        uStack_2f5 = auVar4[9];
        local_308 = (undefined1)uVar3;
        uStack_307 = (undefined1)((ulong)uVar3 >> 8);
        uStack_306 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_305 = (undefined1)((ulong)uVar3 >> 0x18);
        local_318 = auVar7[2];
        uStack_317 = auVar7[3];
        uStack_316 = auVar7[4];
        uStack_315 = auVar7[5];
        local_328 = auVar8[4];
        uStack_327 = auVar8[5];
        uStack_326 = auVar8[6];
        uStack_325 = auVar8[7];
        local_338 = auVar9[6];
        uStack_337 = auVar9[7];
        uStack_336 = auVar9[8];
        uStack_335 = auVar9[9];
        auVar14[1] = local_2d8;
        auVar14[0] = local_2c8;
        auVar14[2] = uStack_2c7;
        auVar14[3] = uStack_2d7;
        auVar14[4] = uStack_2c6;
        auVar14[5] = uStack_2d6;
        auVar14[6] = uStack_2c5;
        auVar14[7] = uStack_2d5;
        auVar14[9] = local_318;
        auVar14[8] = local_308;
        auVar14[10] = uStack_307;
        auVar14[0xb] = uStack_317;
        auVar14[0xc] = uStack_306;
        auVar14[0xd] = uStack_316;
        auVar14[0xe] = uStack_305;
        auVar14[0xf] = uStack_315;
        auVar13[1] = local_2f8;
        auVar13[0] = local_2e8;
        auVar13[2] = uStack_2e7;
        auVar13[3] = uStack_2f7;
        auVar13[4] = uStack_2e6;
        auVar13[5] = uStack_2f6;
        auVar13[6] = uStack_2e5;
        auVar13[7] = uStack_2f5;
        auVar13[9] = local_338;
        auVar13[8] = local_328;
        auVar13[10] = uStack_327;
        auVar13[0xb] = uStack_337;
        auVar13[0xc] = uStack_326;
        auVar13[0xd] = uStack_336;
        auVar13[0xe] = uStack_325;
        auVar13[0xf] = uStack_335;
        auVar18 = pmaddubsw(auVar14,auVar16);
        auVar19 = pmaddubsw(auVar13,auVar17);
        local_e8 = auVar18._0_2_;
        sStack_e6 = auVar18._2_2_;
        sStack_e4 = auVar18._4_2_;
        sStack_e2 = auVar18._6_2_;
        sStack_e0 = auVar18._8_2_;
        sStack_de = auVar18._10_2_;
        sStack_dc = auVar18._12_2_;
        sStack_da = auVar18._14_2_;
        *(ulong *)(local_598 + (long)local_72c * 2) =
             CONCAT26(sStack_e2 + auVar19._6_2_,
                      CONCAT24(sStack_e4 + auVar19._4_2_,
                               CONCAT22(sStack_e6 + auVar19._2_2_,local_e8 + auVar19._0_2_)));
        *(ulong *)(local_598 + (long)in_ECX * 2 + (long)local_72c * 2) =
             CONCAT26(sStack_da + auVar19._14_2_,
                      CONCAT24(sStack_dc + auVar19._12_2_,
                               CONCAT22(sStack_de + auVar19._10_2_,sStack_e0 + auVar19._8_2_)));
        local_72c = local_72c + 4;
      }
      local_590 = local_590 + (in_EDX << 1);
      local_598 = local_598 + (long)(in_ECX << 1) * 2;
    }
    if (local_5b0 != 0) {
      local_72c = 0;
      for (local_5b4 = 0; SBORROW4(local_5b4,offset_1 * 2) != local_5b4 + offset_1 * -2 < 0;
          local_5b4 = local_5b4 + 4) {
        pauVar1 = (undefined1 (*) [16])(local_590 + -2 + (long)local_72c);
        uVar2 = *(undefined8 *)*pauVar1;
        auVar4 = *pauVar1;
        auVar19 = *pauVar1;
        auVar18 = *pauVar1;
        local_348 = (undefined1)uVar2;
        uStack_347 = (undefined1)((ulong)uVar2 >> 8);
        uStack_346 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_345 = (undefined1)((ulong)uVar2 >> 0x18);
        local_358 = auVar18[2];
        uStack_357 = auVar18[3];
        uStack_356 = auVar18[4];
        uStack_355 = auVar18[5];
        local_368 = auVar19[4];
        uStack_367 = auVar19[5];
        uStack_366 = auVar19[6];
        uStack_365 = auVar19[7];
        local_378 = auVar4[6];
        uStack_377 = auVar4[7];
        uStack_376 = auVar4[8];
        uStack_375 = auVar4[9];
        auVar12[1] = local_358;
        auVar12[0] = local_348;
        auVar12[2] = uStack_347;
        auVar12[3] = uStack_357;
        auVar12[4] = uStack_346;
        auVar12[5] = uStack_356;
        auVar12[6] = uStack_345;
        auVar12[7] = uStack_355;
        auVar11[1] = local_378;
        auVar11[0] = local_368;
        auVar11[2] = uStack_367;
        auVar11[3] = uStack_377;
        auVar11[4] = uStack_366;
        auVar11[5] = uStack_376;
        auVar11[6] = uStack_365;
        auVar11[7] = uStack_375;
        auVar12._8_8_ = 0;
        auVar18 = pmaddubsw(auVar12,auVar16);
        auVar11._8_8_ = 0;
        auVar19 = pmaddubsw(auVar11,auVar17);
        local_108 = auVar18._0_2_;
        sStack_106 = auVar18._2_2_;
        sStack_104 = auVar18._4_2_;
        sStack_102 = auVar18._6_2_;
        local_118 = auVar19._0_2_;
        sStack_116 = auVar19._2_2_;
        sStack_114 = auVar19._4_2_;
        sStack_112 = auVar19._6_2_;
        *(ulong *)(local_598 + (long)local_72c * 2) =
             CONCAT26(sStack_102 + sStack_112,
                      CONCAT24(sStack_104 + sStack_114,
                               CONCAT22(sStack_106 + sStack_116,local_108 + local_118)));
        local_72c = local_72c + 4;
      }
    }
  }
  else {
    for (; 1 < local_5b0; local_5b0 = local_5b0 + -2) {
      local_730 = 0;
      for (local_5b4 = 0; SBORROW4(local_5b4,offset_1 * 2) != local_5b4 + offset_1 * -2 < 0;
          local_5b4 = local_5b4 + 8) {
        pauVar1 = (undefined1 (*) [16])(local_590 + -2 + (long)local_730);
        uVar2 = *(undefined8 *)*pauVar1;
        auVar4 = *pauVar1;
        auVar19 = *pauVar1;
        auVar18 = *pauVar1;
        pauVar1 = (undefined1 (*) [16])((long)local_730 + -2 + local_590 + in_EDX);
        uVar3 = *(undefined8 *)*pauVar1;
        auVar5 = *pauVar1;
        auVar8 = *pauVar1;
        auVar7 = *pauVar1;
        local_388 = (undefined1)uVar2;
        uStack_387 = (undefined1)((ulong)uVar2 >> 8);
        uStack_386 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_385 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_384 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_383 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_382 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_381 = (undefined1)((ulong)uVar2 >> 0x38);
        local_398 = auVar18[2];
        uStack_397 = auVar18[3];
        uStack_396 = auVar18[4];
        uStack_395 = auVar18[5];
        uStack_394 = auVar18[6];
        uStack_393 = auVar18[7];
        uStack_392 = auVar18[8];
        uStack_391 = auVar18[9];
        local_3a8 = auVar19[4];
        uStack_3a7 = auVar19[5];
        uStack_3a6 = auVar19[6];
        uStack_3a5 = auVar19[7];
        uStack_3a4 = auVar19[8];
        uStack_3a3 = auVar19[9];
        uStack_3a2 = auVar19[10];
        uStack_3a1 = auVar19[0xb];
        local_3b8 = auVar4[6];
        uStack_3b7 = auVar4[7];
        uStack_3b6 = auVar4[8];
        uStack_3b5 = auVar4[9];
        uStack_3b4 = auVar4[10];
        uStack_3b3 = auVar4[0xb];
        uStack_3b2 = auVar4[0xc];
        uStack_3b1 = auVar4[0xd];
        auVar10[1] = local_398;
        auVar10[0] = local_388;
        auVar10[2] = uStack_387;
        auVar10[3] = uStack_397;
        auVar10[4] = uStack_386;
        auVar10[5] = uStack_396;
        auVar10[6] = uStack_385;
        auVar10[7] = uStack_395;
        auVar10[9] = uStack_394;
        auVar10[8] = uStack_384;
        auVar10[10] = uStack_383;
        auVar10[0xb] = uStack_393;
        auVar10[0xc] = uStack_382;
        auVar10[0xd] = uStack_392;
        auVar10[0xe] = uStack_381;
        auVar10[0xf] = uStack_391;
        auVar18 = pmaddubsw(auVar10,auVar16);
        auVar9[1] = local_3b8;
        auVar9[0] = local_3a8;
        auVar9[2] = uStack_3a7;
        auVar9[3] = uStack_3b7;
        auVar9[4] = uStack_3a6;
        auVar9[5] = uStack_3b6;
        auVar9[6] = uStack_3a5;
        auVar9[7] = uStack_3b5;
        auVar9[9] = uStack_3b4;
        auVar9[8] = uStack_3a4;
        auVar9[10] = uStack_3a3;
        auVar9[0xb] = uStack_3b3;
        auVar9[0xc] = uStack_3a2;
        auVar9[0xd] = uStack_3b2;
        auVar9[0xe] = uStack_3a1;
        auVar9[0xf] = uStack_3b1;
        auVar19 = pmaddubsw(auVar9,auVar17);
        local_128 = auVar18._0_2_;
        sStack_126 = auVar18._2_2_;
        sStack_124 = auVar18._4_2_;
        sStack_122 = auVar18._6_2_;
        sStack_120 = auVar18._8_2_;
        sStack_11e = auVar18._10_2_;
        sStack_11c = auVar18._12_2_;
        sStack_11a = auVar18._14_2_;
        local_138 = auVar19._0_2_;
        sStack_136 = auVar19._2_2_;
        sStack_134 = auVar19._4_2_;
        sStack_132 = auVar19._6_2_;
        sStack_130 = auVar19._8_2_;
        sStack_12e = auVar19._10_2_;
        sStack_12c = auVar19._12_2_;
        sStack_12a = auVar19._14_2_;
        puVar15 = (undefined8 *)(local_598 + (long)local_730 * 2);
        *puVar15 = CONCAT26(sStack_122 + sStack_132,
                            CONCAT24(sStack_124 + sStack_134,
                                     CONCAT22(sStack_126 + sStack_136,local_128 + local_138)));
        puVar15[1] = CONCAT26(sStack_11a + sStack_12a,
                              CONCAT24(sStack_11c + sStack_12c,
                                       CONCAT22(sStack_11e + sStack_12e,sStack_120 + sStack_130)));
        local_3c8 = (undefined1)uVar3;
        uStack_3c7 = (undefined1)((ulong)uVar3 >> 8);
        uStack_3c6 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_3c5 = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_3c4 = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_3c3 = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_3c2 = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_3c1 = (undefined1)((ulong)uVar3 >> 0x38);
        local_3d8 = auVar7[2];
        uStack_3d7 = auVar7[3];
        uStack_3d6 = auVar7[4];
        uStack_3d5 = auVar7[5];
        uStack_3d4 = auVar7[6];
        uStack_3d3 = auVar7[7];
        uStack_3d2 = auVar7[8];
        uStack_3d1 = auVar7[9];
        local_3e8 = auVar8[4];
        uStack_3e7 = auVar8[5];
        uStack_3e6 = auVar8[6];
        uStack_3e5 = auVar8[7];
        uStack_3e4 = auVar8[8];
        uStack_3e3 = auVar8[9];
        uStack_3e2 = auVar8[10];
        uStack_3e1 = auVar8[0xb];
        local_3f8 = auVar5[6];
        uStack_3f7 = auVar5[7];
        uStack_3f6 = auVar5[8];
        uStack_3f5 = auVar5[9];
        uStack_3f4 = auVar5[10];
        uStack_3f3 = auVar5[0xb];
        uStack_3f2 = auVar5[0xc];
        uStack_3f1 = auVar5[0xd];
        auVar8[1] = local_3d8;
        auVar8[0] = local_3c8;
        auVar8[2] = uStack_3c7;
        auVar8[3] = uStack_3d7;
        auVar8[4] = uStack_3c6;
        auVar8[5] = uStack_3d6;
        auVar8[6] = uStack_3c5;
        auVar8[7] = uStack_3d5;
        auVar8[9] = uStack_3d4;
        auVar8[8] = uStack_3c4;
        auVar8[10] = uStack_3c3;
        auVar8[0xb] = uStack_3d3;
        auVar8[0xc] = uStack_3c2;
        auVar8[0xd] = uStack_3d2;
        auVar8[0xe] = uStack_3c1;
        auVar8[0xf] = uStack_3d1;
        auVar18 = pmaddubsw(auVar8,auVar16);
        auVar7[1] = local_3f8;
        auVar7[0] = local_3e8;
        auVar7[2] = uStack_3e7;
        auVar7[3] = uStack_3f7;
        auVar7[4] = uStack_3e6;
        auVar7[5] = uStack_3f6;
        auVar7[6] = uStack_3e5;
        auVar7[7] = uStack_3f5;
        auVar7[9] = uStack_3f4;
        auVar7[8] = uStack_3e4;
        auVar7[10] = uStack_3e3;
        auVar7[0xb] = uStack_3f3;
        auVar7[0xc] = uStack_3e2;
        auVar7[0xd] = uStack_3f2;
        auVar7[0xe] = uStack_3e1;
        auVar7[0xf] = uStack_3f1;
        auVar19 = pmaddubsw(auVar7,auVar17);
        local_148 = auVar18._0_2_;
        sStack_146 = auVar18._2_2_;
        sStack_144 = auVar18._4_2_;
        sStack_142 = auVar18._6_2_;
        sStack_140 = auVar18._8_2_;
        sStack_13e = auVar18._10_2_;
        sStack_13c = auVar18._12_2_;
        sStack_13a = auVar18._14_2_;
        auVar4._2_2_ = sStack_146 + auVar19._2_2_;
        auVar4._0_2_ = local_148 + auVar19._0_2_;
        auVar4._4_2_ = sStack_144 + auVar19._4_2_;
        auVar4._6_2_ = sStack_142 + auVar19._6_2_;
        auVar4._10_2_ = sStack_13e + auVar19._10_2_;
        auVar4._8_2_ = sStack_140 + auVar19._8_2_;
        auVar4._12_2_ = sStack_13c + auVar19._12_2_;
        auVar4._14_2_ = sStack_13a + auVar19._14_2_;
        *(undefined1 (*) [16])(local_598 + (long)in_ECX * 2 + (long)local_730 * 2) = auVar4;
        local_730 = local_730 + 8;
      }
      local_590 = local_590 + (in_EDX << 1);
      local_598 = local_598 + (long)(in_ECX << 1) * 2;
    }
    if (local_5b0 != 0) {
      local_730 = 0;
      for (local_5b4 = 0; SBORROW4(local_5b4,offset_1 * 2) != local_5b4 + offset_1 * -2 < 0;
          local_5b4 = local_5b4 + 8) {
        pauVar1 = (undefined1 (*) [16])(local_590 + -2 + (long)local_730);
        uVar2 = *(undefined8 *)*pauVar1;
        auVar4 = *pauVar1;
        auVar19 = *pauVar1;
        auVar18 = *pauVar1;
        local_408 = (undefined1)uVar2;
        uStack_407 = (undefined1)((ulong)uVar2 >> 8);
        uStack_406 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_405 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_404 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_403 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_402 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_401 = (undefined1)((ulong)uVar2 >> 0x38);
        local_418 = auVar18[2];
        uStack_417 = auVar18[3];
        uStack_416 = auVar18[4];
        uStack_415 = auVar18[5];
        uStack_414 = auVar18[6];
        uStack_413 = auVar18[7];
        uStack_412 = auVar18[8];
        uStack_411 = auVar18[9];
        local_428 = auVar19[4];
        uStack_427 = auVar19[5];
        uStack_426 = auVar19[6];
        uStack_425 = auVar19[7];
        uStack_424 = auVar19[8];
        uStack_423 = auVar19[9];
        uStack_422 = auVar19[10];
        uStack_421 = auVar19[0xb];
        local_438 = auVar4[6];
        uStack_437 = auVar4[7];
        uStack_436 = auVar4[8];
        uStack_435 = auVar4[9];
        uStack_434 = auVar4[10];
        uStack_433 = auVar4[0xb];
        uStack_432 = auVar4[0xc];
        uStack_431 = auVar4[0xd];
        auVar6[1] = local_418;
        auVar6[0] = local_408;
        auVar6[2] = uStack_407;
        auVar6[3] = uStack_417;
        auVar6[4] = uStack_406;
        auVar6[5] = uStack_416;
        auVar6[6] = uStack_405;
        auVar6[7] = uStack_415;
        auVar6[9] = uStack_414;
        auVar6[8] = uStack_404;
        auVar6[10] = uStack_403;
        auVar6[0xb] = uStack_413;
        auVar6[0xc] = uStack_402;
        auVar6[0xd] = uStack_412;
        auVar6[0xe] = uStack_401;
        auVar6[0xf] = uStack_411;
        auVar18 = pmaddubsw(auVar6,auVar16);
        auVar5[1] = local_438;
        auVar5[0] = local_428;
        auVar5[2] = uStack_427;
        auVar5[3] = uStack_437;
        auVar5[4] = uStack_426;
        auVar5[5] = uStack_436;
        auVar5[6] = uStack_425;
        auVar5[7] = uStack_435;
        auVar5[9] = uStack_434;
        auVar5[8] = uStack_424;
        auVar5[10] = uStack_423;
        auVar5[0xb] = uStack_433;
        auVar5[0xc] = uStack_422;
        auVar5[0xd] = uStack_432;
        auVar5[0xe] = uStack_421;
        auVar5[0xf] = uStack_431;
        auVar19 = pmaddubsw(auVar5,auVar17);
        local_168 = auVar18._0_2_;
        sStack_166 = auVar18._2_2_;
        sStack_164 = auVar18._4_2_;
        sStack_162 = auVar18._6_2_;
        sStack_160 = auVar18._8_2_;
        sStack_15e = auVar18._10_2_;
        sStack_15c = auVar18._12_2_;
        sStack_15a = auVar18._14_2_;
        local_178 = auVar19._0_2_;
        sStack_176 = auVar19._2_2_;
        sStack_174 = auVar19._4_2_;
        sStack_172 = auVar19._6_2_;
        sStack_170 = auVar19._8_2_;
        sStack_16e = auVar19._10_2_;
        sStack_16c = auVar19._12_2_;
        sStack_16a = auVar19._14_2_;
        puVar15 = (undefined8 *)(local_598 + (long)local_730 * 2);
        *puVar15 = CONCAT26(sStack_162 + sStack_172,
                            CONCAT24(sStack_164 + sStack_174,
                                     CONCAT22(sStack_166 + sStack_176,local_168 + local_178)));
        puVar15[1] = CONCAT26(sStack_15a + sStack_16a,
                              CONCAT24(sStack_15c + sStack_16c,
                                       CONCAT22(sStack_15e + sStack_16e,sStack_160 + sStack_170)));
        local_730 = local_730 + 8;
      }
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz_w16out_ssse3(UWORD8 *pu1_src,
                                               WORD16 *pi2_dst,
                                               WORD32 src_strd,
                                               WORD32 dst_strd,
                                               WORD8 *pi1_coeff,
                                               WORD32 ht,
                                               WORD32 wd)
{
    WORD32 row, col;

    __m128i coeff0_1_8x16b, coeff2_3_8x16b, control_mask_1_8x16b, control_mask_2_8x16b, all_zero;
    __m128i src_temp1_16x8b, src_temp2_16x8b, src_temp3_16x8b, src_temp4_16x8b, src_temp5_16x8b, src_temp6_16x8b;
    __m128i src_temp11_16x8b, src_temp12_16x8b, src_temp13_16x8b, src_temp14_16x8b, src_temp15_16x8b, src_temp16_16x8b;
    __m128i res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
    __m128i res_temp11_8x16b, res_temp12_8x16b, res_temp13_8x16b;

    PREFETCH((char const *)(pu1_src + (0 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (1 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (2 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (3 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)

    ASSERT(wd % 2 == 0); /* checking assumption*/

/* loading four 8-bit coefficients and convert 8-bit into 16-bit */
    src_temp1_16x8b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    all_zero = _mm_setzero_si128();

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_2_8x16b);  /* pi1_coeff[4] */

/*  outer for loop starts from here */
    if(wd % 2 == 0 && wd % 4 != 0)
    {
        int offset = 0;
        for(row = ht; row >= 2; row -= 2)
        {
            offset = 0;
            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 4)
            {

                /*load 16 pixel values of row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values of row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel of row 0*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 0*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 0*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                /*Derive the source pixels for processing the 2nd pixel of row 1*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 1*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 1*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp1_8x16b = _mm_unpacklo_epi64(src_temp5_16x8b, src_temp15_16x8b);
                res_temp2_8x16b = _mm_unpacklo_epi64(src_temp6_16x8b, src_temp16_16x8b);
                res_temp11_8x16b = _mm_maddubs_epi16(res_temp1_8x16b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(res_temp2_8x16b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                res_temp3_8x16b = _mm_srli_si128(res_temp13_8x16b, 8);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pi2_dst + offset), res_temp13_8x16b); /* pi2_dst[col] = i2_tmp_u  */



                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pi2_dst + dst_strd + offset), res_temp3_8x16b); /* pi2_dst[col] = i2_tmp_u  */


                offset += 4; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pi2_dst += 2 * dst_strd; /*pointer update*/
        }

        /*Epilogue to handle ht= odd case*/
        if(row)
        {
            offset = 0;
            for(col = 0; col < 2 * wd; col += 4)
            {

                /*load 16 pixel values of row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel of row 0*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 0*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 0*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_unpacklo_epi64(src_temp5_16x8b, all_zero);
                res_temp2_8x16b = _mm_unpacklo_epi64(src_temp6_16x8b, all_zero);
                res_temp11_8x16b = _mm_maddubs_epi16(res_temp1_8x16b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(res_temp2_8x16b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                //res_temp3_8x16b = _mm_srli_si128 (res_temp13_8x16b, 8);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pi2_dst + offset), res_temp13_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                offset += 4; /* To pointer update*/

            }
        }

    }
    else
    {
        int offset = 0;

        for(row = ht; row >= 2; row -= 2)
        {
            offset = 0;
            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 8)
            {

                /*load 16 pixel values of row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values of row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel of row 0*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 0*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 0*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff0_1_8x16b);
                res_temp2_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp3_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);

                /* store 8 16-bit values */
                _mm_storeu_si128((__m128i *)(pi2_dst + offset), res_temp3_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                /*Derive the source pixels for processing the 2nd pixel of row 1*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 1*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 1*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp11_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                /* store 8 16-bit values */
                _mm_storeu_si128((__m128i *)(pi2_dst + dst_strd + offset), res_temp13_8x16b); /* pi2_dst[col] = i2_tmp_u  */


                offset += 8; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pi2_dst += 2 * dst_strd; /*pointer update*/
        }

        /*Epilogue to take care of odd ht*/
        if(row)
        {
            offset = 0;
            for(col = 0; col < 2 * wd; col += 8)
            {

                /*load 16 pixel values of row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel of row 0*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 0*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 0*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff0_1_8x16b);
                res_temp2_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp3_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);

                /* store 8 16-bit values */
                _mm_storeu_si128((__m128i *)(pi2_dst + offset), res_temp3_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                offset += 8; /* To pointer update*/

            }
        }

    }
}